

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

RK_U32 mpp_slots_is_empty(MppBufSlots slots,SlotQueueType type)

{
  int iVar1;
  undefined1 local_38 [8];
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  SlotQueueType type_local;
  MppBufSlots slots_local;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_slots_is_empty");
    slots_local._4_4_ = 0;
  }
  else {
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)local_38,*slots,1);
    iVar1 = list_empty((list_head *)((long)&auto_lock.mLock[4].mMutex + (ulong)type * 0x10));
    slots_local._4_4_ = (uint)(iVar1 != 0);
    Mutex::Autolock::~Autolock((Autolock *)local_38);
  }
  return slots_local._4_4_;
}

Assistant:

RK_U32 mpp_slots_is_empty(MppBufSlots slots, SlotQueueType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return 0;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    return list_empty(&impl->queue[type]) ? 1 : 0;
}